

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_ToOctString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToOctString_Test *this)

{
  size_t i;
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffce8;
  AssertionResult local_310;
  AssertionHelper local_2e8;
  undefined1 local_2b8 [400];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_2b8[0] = (stringstream)0x30;
  local_2b8._1_2_ = 0x3030;
  local_2b8[3] = 0;
  local_48[0] = local_38;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"000\"","::iutest::detail::ToOctString< ::iutest::UInt8 >(0)",
             "000",(char *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xd7;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0] = (stringstream)0x30;
  local_2b8._1_2_ = 0x3030;
  local_2b8[3] = 0x30;
  local_2b8[4] = 0x30;
  local_2b8._5_2_ = 0x30;
  local_68[0] = local_58;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt16 >(0)","000000",(char *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xd8;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0] = (stringstream)0x30;
  local_2b8._1_2_ = 0x3030;
  local_2b8[3] = 0x30;
  local_2b8[4] = 0x30;
  local_2b8._5_2_ = 0x3030;
  local_2b8[7] = 0x30;
  local_2b8[8] = 0x30;
  local_2b8._9_2_ = 0x3030;
  local_2b8[0xb] = 0;
  local_88[0] = local_78;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"00000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt32 >(0)","00000000000",(char *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xd9;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0x10] = 0x30;
  local_2b8._17_5_ = 0x3030303030;
  local_2b8[0] = (stringstream)0x30;
  local_2b8._1_2_ = 0x3030;
  local_2b8[3] = 0x30;
  local_2b8[4] = 0x30;
  local_2b8._5_2_ = 0x3030;
  local_2b8[7] = 0x30;
  local_2b8[8] = 0x30;
  local_2b8._9_2_ = 0x3030;
  local_2b8[0xb] = 0x30;
  local_2b8._12_2_ = 0x3030;
  local_2b8[0xe] = 0x30;
  local_2b8[0xf] = 0x30;
  local_2b8[0x16] = 0;
  local_a8[0] = local_98;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"0000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt64 >(0)","0000000000000000000000",
             (char *)local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xda;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0] = (stringstream)0x31;
  local_2b8._1_2_ = 0x3737;
  local_2b8[3] = 0x37;
  local_2b8[4] = 0x37;
  local_2b8._5_2_ = 0x3737;
  local_2b8[7] = 0x37;
  local_2b8[8] = 0x37;
  local_2b8._9_2_ = 0x3737;
  local_2b8[0xb] = 0x37;
  local_2b8._12_2_ = 0x3737;
  local_2b8[0xe] = 0x37;
  local_2b8[0xf] = 0x37;
  local_2b8[0x10] = 0x37;
  local_2b8._17_5_ = 0x3737373737;
  local_2b8[0x16] = 0;
  local_c8[0] = local_b8;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"1777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >(-1)","1777777777777777777777",
             (char *)local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xdb;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = local_2b8;
  local_2b8._1_2_ = 0;
  local_2b8[3] = 0;
  local_2b8[4] = 0;
  local_2b8._5_2_ = 0;
  local_2b8[7] = 0;
  local_2b8[8] = 0;
  local_2b8._9_2_ = 0;
  local_2b8[0xb] = 0;
  local_2b8._12_2_ = 0;
  local_2b8[0xe] = 0;
  local_2b8[0xf] = 0;
  local_2b8[0x10] = 0;
  local_2b8._17_5_ = 0;
  local_2b8[0] = (stringstream)0x30;
  lVar4 = 0x3c;
  do {
    pbVar2 = pbVar2 + 1;
    *pbVar2 = (byte)(0x7fffffffffffffff >> ((byte)lVar4 & 0x3f)) & 7 | 0x30;
    lVar4 = lVar4 + -3;
  } while (lVar4 != -3);
  local_2b8[0x16] = 0;
  local_e8[0] = local_d8;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"0777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((9223372036854775807L))",
             "0777777777777777777777",(char *)local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xdd;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = local_2b8;
  local_2b8._1_2_ = 0;
  local_2b8[3] = 0;
  local_2b8[4] = 0;
  local_2b8._5_2_ = 0;
  local_2b8[7] = 0;
  local_2b8[8] = 0;
  local_2b8._9_2_ = 0;
  local_2b8[0xb] = 0;
  local_2b8._12_2_ = 0;
  local_2b8[0xe] = 0;
  local_2b8[0xf] = 0;
  local_2b8[0x10] = 0;
  local_2b8._17_5_ = 0;
  local_2b8[0] = (stringstream)0x31;
  lVar4 = 0x3c;
  do {
    pbVar2 = pbVar2 + 1;
    *pbVar2 = (byte)(-0x8000000000000000 >> ((byte)lVar4 & 0x3f)) & 7 | 0x30;
    lVar4 = lVar4 + -3;
  } while (lVar4 != -3);
  local_2b8[0x16] = 0;
  local_108[0] = local_f8;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"1000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "1000000000000000000000",(char *)local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xde;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0] = (stringstream)0x33;
  local_2b8._1_2_ = 0;
  lVar4 = 1;
  bVar3 = 3;
  do {
    local_2b8[lVar4] = (byte)(0xff >> (bVar3 & 0x1f)) & 7 | 0x30;
    lVar4 = lVar4 + 1;
    bVar3 = bVar3 - 3;
  } while (lVar4 != 3);
  local_2b8[3] = 0;
  local_128[0] = local_118;
  sVar1 = strlen(local_2b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,local_2b8,local_2b8 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_310,(internal *)"\"377\"",
             "::iutest::detail::ToOctString< ::iutest::UInt8 >(0377u)","377",(char *)local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffce8);
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  if (local_310.m_result == false) {
    memset((iu_global_format_stringstream *)local_2b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_310.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcef);
    local_2e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2e8.m_part_result.super_iuCodeMessage.m_line = 0xe0;
    local_2e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2e8,(Fixed *)local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != &local_310.m_message.field_2) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, ToOctString)
{
    IUTEST_EXPECT_STREQ(                   "000", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(                "000000", ::iutest::detail::ToOctString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(           "00000000000", ::iutest::detail::ToOctString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000000000", ::iutest::detail::ToOctString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("1777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("0777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("1000000000000000000000", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(                   "377", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0377u));
}